

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableRequiresCommand.h
# Opt level: O2

void __thiscall
cmVariableRequiresCommand::~cmVariableRequiresCommand(cmVariableRequiresCommand *this)

{
  cmCommand::~cmCommand(&this->super_cmCommand);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmVariableRequiresCommand; }